

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

int __thiscall
vkt::memory::anon_unknown_0::FillBuffer::verify
          (FillBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  ulong *puVar1;
  ulong in_RAX;
  byte bVar2;
  
  if (this->m_bufferSize != 0) {
    bVar2 = 0;
    in_RAX = 0;
    do {
      *(char *)(*(long *)(ctx + 0x18) + in_RAX) = (char)(this->m_value >> (bVar2 & 0x18));
      puVar1 = (ulong *)(*(long *)(ctx + 0x30) + (in_RAX >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)in_RAX & 0x3f);
      in_RAX = in_RAX + 1;
      bVar2 = bVar2 + 8;
    } while (in_RAX < this->m_bufferSize);
  }
  return (int)in_RAX;
}

Assistant:

void FillBuffer::verify (VerifyContext& context, size_t)
{
	ReferenceMemory&	reference	= context.getReference();

	for (size_t ndx = 0; ndx < m_bufferSize; ndx++)
	{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
		reference.set(ndx, (deUint8)(0xffu & (m_value >> (8*(ndx % 4)))));
#else
		reference.set(ndx, (deUint8)(0xffu & (m_value >> (8*(3 - (ndx % 4))))));
#endif
	}
}